

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

uint64_t __thiscall CLIntercept::computeHash(CLIntercept *this,void *ptr,size_t length)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if (ptr != (void *)0x0) {
    uVar6 = 0x428a2f98;
    uVar2 = 0xb5c0fbcf;
    uVar4 = 0x71374491;
    for (uVar5 = 0; length >> 2 != uVar5; uVar5 = uVar5 + 1) {
      uVar7 = uVar2 >> 0xd ^ ((uVar6 ^ *(uint *)((long)ptr + uVar5 * 4)) - uVar2) - uVar4;
      uVar6 = uVar7 << 8 ^ (uVar4 - uVar2) - uVar7;
      uVar4 = uVar6 >> 0xd ^ (uVar2 - uVar7) - uVar6;
      uVar2 = uVar4 >> 0xc ^ (uVar7 - uVar6) - uVar4;
      uVar7 = uVar2 << 0x10 ^ (uVar6 - uVar4) - uVar2;
      uVar8 = uVar7 >> 5 ^ (uVar4 - uVar2) - uVar7;
      uVar6 = uVar8 >> 3 ^ (uVar2 - uVar7) - uVar8;
      uVar4 = uVar6 << 10 ^ (uVar7 - uVar8) - uVar6;
      uVar2 = uVar4 >> 0xf ^ (uVar8 - uVar6) - uVar4;
    }
    if ((length & 3) != 0) {
      pbVar3 = (byte *)((long)ptr + (length & 0xfffffffffffffffc));
      uVar7 = 0;
      for (uVar5 = 0; (uint)((int)(length & 3) << 3) != uVar5; uVar5 = uVar5 + 8) {
        bVar1 = *pbVar3;
        pbVar3 = pbVar3 + 1;
        uVar7 = uVar7 + ((uint)bVar1 << ((byte)uVar5 & 0x1f));
      }
      uVar6 = uVar2 >> 0xd ^ ((uVar7 ^ uVar6) - uVar2) - uVar4;
      uVar4 = uVar6 << 8 ^ (uVar4 - uVar2) - uVar6;
      uVar7 = uVar4 >> 0xd ^ (uVar2 - uVar6) - uVar4;
      uVar2 = uVar7 >> 0xc ^ (uVar6 - uVar4) - uVar7;
      uVar4 = uVar2 << 0x10 ^ (uVar4 - uVar7) - uVar2;
      uVar6 = uVar4 >> 5 ^ (uVar7 - uVar2) - uVar4;
      uVar2 = uVar6 >> 3 ^ (uVar2 - uVar4) - uVar6;
      uVar4 = uVar2 << 10 ^ (uVar4 - uVar6) - uVar2;
      uVar2 = uVar4 >> 0xf ^ uVar6 - (uVar2 + uVar4);
    }
    return CONCAT44(uVar4,uVar2);
  }
  return 0;
}

Assistant:

uint64_t CLIntercept::computeHash(
    const void* ptr,
    size_t length )
{
    uint64_t    hash = 0;

    if( ptr != NULL )
    {
        hash = Hash( ptr, length );
    }

    return hash;
}